

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void NavUpdateWindowingHighlightWindow(int focus_change_dir)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  ImGuiWindow *pIVar3;
  int i_start;
  ImGuiContext *g;
  int i;
  
  pIVar1 = GImGui;
  pIVar3 = GImGui->NavWindowingTarget;
  if (pIVar3 == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindowingTarget",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xb17,"void NavUpdateWindowingHighlightWindow(int)");
  }
  if ((pIVar3->Flags & 0x8000000) == 0) {
    this = &GImGui->Windows;
    i = (GImGui->Windows).Size;
    do {
      if (i < 1) {
        i = -1;
        break;
      }
      i = i + -1;
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](this,i);
    } while (*ppIVar2 != pIVar3);
    pIVar3 = FindWindowNavigable(i + focus_change_dir,-0x7fffffff,focus_change_dir);
    if (pIVar3 == (ImGuiWindow *)0x0) {
      i_start = 0;
      if (focus_change_dir < 0) {
        i_start = this->Size + -1;
      }
      pIVar3 = FindWindowNavigable(i_start,i,focus_change_dir);
    }
    pIVar1->NavWindowingTarget = pIVar3;
    pIVar1->NavWindowingToggleLayer = false;
  }
  return;
}

Assistant:

static void NavUpdateWindowingHighlightWindow(int focus_change_dir)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget);
    if (g.NavWindowingTarget->Flags & ImGuiWindowFlags_Modal)
        return;

    const int i_current = FindWindowIndex(g.NavWindowingTarget);
    ImGuiWindow* window_target = FindWindowNavigable(i_current + focus_change_dir, -INT_MAX, focus_change_dir);
    if (!window_target)
        window_target = FindWindowNavigable((focus_change_dir < 0) ? (g.Windows.Size - 1) : 0, i_current, focus_change_dir);
    g.NavWindowingTarget = window_target;
    g.NavWindowingToggleLayer = false;
}